

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Designator_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Designator_PDU::Designator_PDU
          (Designator_PDU *this,EntityIdentifier *DesignatingEntityID,DesignatorCodeName CodeName,
          EntityIdentifier *DesignatedEntityID,DesignatorCode Code,KFLOAT32 Power,
          KFLOAT32 WaveLength,Vector *SpotLocationRegardsToEntity,WorldCoordinates *SpotLocation,
          DeadReckoningAlgorithm DRA,Vector *EntityLinearAcceleration)

{
  KFLOAT64 KVar1;
  KUINT16 KVar2;
  KFLOAT32 KVar3;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Designator_PDU_002214a8;
  (this->m_DesignatingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00223f60;
  KVar2 = (DesignatingEntityID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_DesignatingEntityID).super_SimulationIdentifier.m_ui16SiteID =
       (DesignatingEntityID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_DesignatingEntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar2;
  (this->m_DesignatingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00223c00;
  *(undefined2 *)&(this->m_DesignatingEntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(DesignatingEntityID->super_SimulationIdentifier).field_0xc;
  this->m_ui16CodeName = (KUINT16)CodeName;
  (this->m_DesignatedEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00223f60;
  KVar2 = (DesignatedEntityID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_DesignatedEntityID).super_SimulationIdentifier.m_ui16SiteID =
       (DesignatedEntityID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_DesignatedEntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar2;
  (this->m_DesignatedEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00223c00;
  *(undefined2 *)&(this->m_DesignatedEntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(DesignatedEntityID->super_SimulationIdentifier).field_0xc;
  this->m_ui16Code = (KUINT16)Code;
  this->m_f32Power = Power;
  this->m_f32WaveLength = WaveLength;
  (this->m_SpotRegardsToEntity).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_002241d0;
  KVar3 = SpotLocationRegardsToEntity->m_f32Y;
  (this->m_SpotRegardsToEntity).m_f32X = SpotLocationRegardsToEntity->m_f32X;
  (this->m_SpotRegardsToEntity).m_f32Y = KVar3;
  (this->m_SpotRegardsToEntity).m_f32Z = SpotLocationRegardsToEntity->m_f32Z;
  (this->m_SpotLocation).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00224228;
  KVar1 = SpotLocation->m_f64Y;
  (this->m_SpotLocation).m_f64X = SpotLocation->m_f64X;
  (this->m_SpotLocation).m_f64Y = KVar1;
  (this->m_SpotLocation).m_f64Z = SpotLocation->m_f64Z;
  this->m_ui8DeadReckoningAlgorithm = (undefined1)DRA;
  this->m_ui16Padding1 = 0;
  this->m_ui8Padding2 = '\0';
  (this->m_EntityLinearAcceleration).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_002241d0;
  KVar3 = EntityLinearAcceleration->m_f32Y;
  (this->m_EntityLinearAcceleration).m_f32X = EntityLinearAcceleration->m_f32X;
  (this->m_EntityLinearAcceleration).m_f32Y = KVar3;
  (this->m_EntityLinearAcceleration).m_f32Z = EntityLinearAcceleration->m_f32Z;
  (this->super_Header).super_Header6.m_ui8PDUType = '\x18';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x06';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x58;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x05';
  return;
}

Assistant:

Designator_PDU::Designator_PDU( const EntityIdentifier & DesignatingEntityID, DesignatorCodeName CodeName,
                                const EntityIdentifier & DesignatedEntityID, DesignatorCode Code, KFLOAT32 Power,
                                KFLOAT32 WaveLength, const Vector & SpotLocationRegardsToEntity,
                                const WorldCoordinates & SpotLocation, DeadReckoningAlgorithm DRA,
                                const Vector & EntityLinearAcceleration ) :
    m_DesignatingEntityID( DesignatingEntityID ),
    m_ui16CodeName( CodeName ),
    m_DesignatedEntityID( DesignatedEntityID ),
    m_ui16Code( Code ),
    m_f32Power( Power ),
    m_f32WaveLength( WaveLength ),
    m_SpotRegardsToEntity( SpotLocationRegardsToEntity ),
    m_SpotLocation( SpotLocation ),
    m_ui8DeadReckoningAlgorithm( DRA ),
    m_ui16Padding1( 0 ),
    m_ui8Padding2( 0 ),
    m_EntityLinearAcceleration( EntityLinearAcceleration )
{
    m_ui8ProtocolFamily = Distributed_Emission_Regeneration;
    m_ui8PDUType = Designator_PDU_Type;
    m_ui16PDULength = DESIGNATOR_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1_1995;
}